

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O0

TRef fold_simplify_intsubadd_leftcancel(jit_State *J)

{
  jit_State *J_local;
  
  if (((J->fold).ins.field_1.t.irt & 0x1f) != 0xe) {
    if (((J->fold).left[0].field_1.t.irt & 0x40) != 0) {
      return 0;
    }
    if ((J->fold).ins.field_0.op2 == (J->fold).left[0].field_0.op1) {
      return (uint)(J->fold).left[0].field_0.op2;
    }
    if ((J->fold).ins.field_0.op2 == (J->fold).left[0].field_0.op2) {
      return (uint)(J->fold).left[0].field_0.op1;
    }
  }
  return 0;
}

Assistant:

LJFOLD(SUB ADD any)
LJFOLDF(simplify_intsubadd_leftcancel)
{
  if (!irt_isnum(fins->t)) {
    PHIBARRIER(fleft);
    if (fins->op2 == fleft->op1)  /* (i + j) - i ==> j */
      return fleft->op2;
    if (fins->op2 == fleft->op2)  /* (i + j) - j ==> i */
      return fleft->op1;
  }
  return NEXTFOLD;
}